

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  cmState *pcVar2;
  bool bVar3;
  cmMakefile *this_00;
  string *psVar4;
  cmCommand *pcVar5;
  char *filename;
  auto_ptr<cmMakefile> mf;
  ostringstream cmCTestLog_msg_1;
  cmake cm;
  cmGlobalGenerator gg;
  auto_ptr<cmMakefile> local_a40;
  long *local_a38;
  long local_a28 [2];
  undefined1 local_a18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a08 [6];
  ios_base local_9a8 [264];
  cmake local_8a0;
  undefined1 local_5e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8 [6];
  ios_base local_578 [1368];
  
  if ((this->IncludeLabelRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->IncludeLabelRegularExpression,(this->IncludeLabelRegExp)._M_dataplus._M_p);
  }
  if ((this->ExcludeLabelRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->ExcludeLabelRegularExpression,(this->ExcludeLabelRegExp)._M_dataplus._M_p);
  }
  if ((this->IncludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->IncludeTestsRegularExpression,(this->IncludeRegExp)._M_dataplus._M_p);
  }
  if ((this->ExcludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->ExcludeTestsRegularExpression,(this->ExcludeRegExp)._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5e8,"Constructing a list of tests",0x1c);
  std::ios::widen((char)(ostringstream *)local_5e8 + (char)*(undefined8 *)(local_5e8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_5e8);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x6d7,(char *)local_8a0.Generators.
                              super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
               (this->super_cmCTestGenericHandler).Quiet);
  if (local_8a0.Generators.
      super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_8a0.Generators.
                super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_8a0.Generators.
                    super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8a0.Generators.
                          super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5e8);
  std::ios_base::~ios_base(local_578);
  cmake::cmake(&local_8a0,RoleScript);
  local_5e8._0_8_ = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"");
  cmake::SetHomeDirectory(&local_8a0,(string *)local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._0_8_ != local_5d8) {
    operator_delete((void *)local_5e8._0_8_,local_5d8[0]._M_allocated_capacity + 1);
  }
  local_5e8._0_8_ = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"");
  cmake::SetHomeOutputDirectory(&local_8a0,(string *)local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._0_8_ != local_5d8) {
    operator_delete((void *)local_5e8._0_8_,local_5d8[0]._M_allocated_capacity + 1);
  }
  local_5d8[0]._M_allocated_capacity = local_8a0.CurrentSnapshot.Position.Position;
  local_5e8._0_8_ = local_8a0.CurrentSnapshot.State;
  local_5e8._8_8_ = local_8a0.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_5e8);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_5e8,&local_8a0);
  this_00 = (cmMakefile *)operator_new(0x760);
  local_a08[0]._M_allocated_capacity = local_8a0.CurrentSnapshot.Position.Position;
  local_a18._0_8_ = local_8a0.CurrentSnapshot.State;
  local_a18._8_8_ = local_8a0.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_5e8,(cmStateSnapshot *)local_a18);
  local_a40.x_ = this_00;
  local_a18._0_8_ = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"CTEST_CONFIGURATION_TYPE","")
  ;
  psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  cmMakefile::AddDefinition(this_00,(string *)local_a18,(psVar4->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._0_8_ != local_a08) {
    operator_delete((void *)local_a18._0_8_,local_a08[0]._M_allocated_capacity + 1);
  }
  pcVar5 = (cmCommand *)operator_new(0x38);
  pcVar2 = local_8a0.State;
  pcVar5->Makefile = (cmMakefile *)0x0;
  (pcVar5->Error)._M_dataplus._M_p = (pointer)&(pcVar5->Error).field_2;
  (pcVar5->Error)._M_string_length = 0;
  (pcVar5->Error).field_2._M_local_buf[0] = '\0';
  pcVar5->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00786bd0;
  pcVar5[1]._vptr_cmCommand = (_func_int **)this;
  local_a18._0_8_ = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"add_test","");
  cmState::AddBuiltinCommand(pcVar2,(string *)local_a18,pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._0_8_ != local_a08) {
    operator_delete((void *)local_a18._0_8_,local_a08[0]._M_allocated_capacity + 1);
  }
  pcVar5 = (cmCommand *)operator_new(0x38);
  pcVar2 = local_8a0.State;
  pcVar5->Makefile = (cmMakefile *)0x0;
  (pcVar5->Error)._M_dataplus._M_p = (pointer)&(pcVar5->Error).field_2;
  (pcVar5->Error)._M_string_length = 0;
  (pcVar5->Error).field_2._M_local_buf[0] = '\0';
  pcVar5->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00786b10;
  pcVar5[1]._vptr_cmCommand = (_func_int **)this;
  local_a18._0_8_ = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"subdirs","");
  cmState::AddBuiltinCommand(pcVar2,(string *)local_a18,pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._0_8_ != local_a08) {
    operator_delete((void *)local_a18._0_8_,local_a08[0]._M_allocated_capacity + 1);
  }
  pcVar5 = (cmCommand *)operator_new(0x38);
  pcVar2 = local_8a0.State;
  pcVar5->Makefile = (cmMakefile *)0x0;
  (pcVar5->Error)._M_dataplus._M_p = (pointer)&(pcVar5->Error).field_2;
  (pcVar5->Error)._M_string_length = 0;
  (pcVar5->Error).field_2._M_local_buf[0] = '\0';
  pcVar5->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00786b70;
  pcVar5[1]._vptr_cmCommand = (_func_int **)this;
  local_a18._0_8_ = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"add_subdirectory","");
  cmState::AddBuiltinCommand(pcVar2,(string *)local_a18,pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._0_8_ != local_a08) {
    operator_delete((void *)local_a18._0_8_,local_a08[0]._M_allocated_capacity + 1);
  }
  pcVar5 = (cmCommand *)operator_new(0x38);
  pcVar2 = local_8a0.State;
  pcVar5->Makefile = (cmMakefile *)0x0;
  (pcVar5->Error)._M_dataplus._M_p = (pointer)&(pcVar5->Error).field_2;
  (pcVar5->Error)._M_string_length = 0;
  (pcVar5->Error).field_2._M_local_buf[0] = '\0';
  pcVar5->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00786c30;
  pcVar5[1]._vptr_cmCommand = (_func_int **)this;
  local_a18._0_8_ = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"set_tests_properties","");
  cmState::AddBuiltinCommand(pcVar2,(string *)local_a18,pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._0_8_ != local_a08) {
    operator_delete((void *)local_a18._0_8_,local_a08[0]._M_allocated_capacity + 1);
  }
  pcVar5 = (cmCommand *)operator_new(0x38);
  pcVar5->Makefile = (cmMakefile *)0x0;
  (pcVar5->Error)._M_dataplus._M_p = (pointer)&(pcVar5->Error).field_2;
  (pcVar5->Error)._M_string_length = 0;
  (pcVar5->Error).field_2._M_local_buf[0] = '\0';
  pcVar5->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_00786c90;
  pcVar5[1]._vptr_cmCommand = (_func_int **)this;
  local_a18._0_8_ = local_a08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a18,"set_directory_properties","")
  ;
  cmState::AddBuiltinCommand(local_8a0.State,(string *)local_a18,pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._0_8_ != local_a08) {
    operator_delete((void *)local_a18._0_8_,local_a08[0]._M_allocated_capacity + 1);
  }
  filename = "CTestTestfile.cmake";
  bVar3 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (!bVar3) {
    filename = "DartTestfile.txt";
    bVar3 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    if (!bVar3) goto LAB_002ef47a;
  }
  bVar3 = cmMakefile::ReadListFile(local_a40.x_,filename);
  if (((bVar3) && (cmSystemTools::s_ErrorOccured == false)) &&
     (cmSystemTools::s_FatalErrorOccured == false)) {
    bVar3 = cmSystemTools::GetInterruptFlag();
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_a18,"Done constructing a list of tests",0x21);
      std::ios::widen((char)(ostream *)local_a18 + (char)*(undefined8 *)(local_a18._0_8_ + -0x18));
      std::ostream::put((char)local_a18);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x70f,(char *)local_a38,(this->super_cmCTestGenericHandler).Quiet);
      if (local_a38 != local_a28) {
        operator_delete(local_a38,local_a28[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a18);
      std::ios_base::~ios_base(local_9a8);
    }
  }
LAB_002ef47a:
  ::cm::auto_ptr<cmMakefile>::~auto_ptr(&local_a40);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_5e8);
  cmake::~cmake(&local_8a0);
  return;
}

Assistant:

void cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeLabelRegExp.empty()) {
    this->IncludeLabelRegularExpression.compile(
      this->IncludeLabelRegExp.c_str());
  }
  if (!this->ExcludeLabelRegExp.empty()) {
    this->ExcludeLabelRegularExpression.compile(
      this->ExcludeLabelRegExp.c_str());
  }
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp.c_str());
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp.c_str());
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  CM_AUTO_PTR<cmMakefile> mf(new cmMakefile(&gg, cm.GetCurrentSnapshot()));
  mf->AddDefinition("CTEST_CONFIGURATION_TYPE",
                    this->CTest->GetConfigType().c_str());

  // Add handler for ADD_TEST
  cmCTestAddTestCommand* newCom1 = new cmCTestAddTestCommand;
  newCom1->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("add_test", newCom1);

  // Add handler for SUBDIRS
  cmCTestSubdirCommand* newCom2 = new cmCTestSubdirCommand;
  newCom2->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("subdirs", newCom2);

  // Add handler for ADD_SUBDIRECTORY
  cmCTestAddSubdirectoryCommand* newCom3 = new cmCTestAddSubdirectoryCommand;
  newCom3->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("add_subdirectory", newCom3);

  // Add handler for SET_TESTS_PROPERTIES
  cmCTestSetTestsPropertiesCommand* newCom4 =
    new cmCTestSetTestsPropertiesCommand;
  newCom4->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("set_tests_properties", newCom4);

  // Add handler for SET_DIRECTORY_PROPERTIES
  cmCTestSetDirectoryPropertiesCommand* newCom5 =
    new cmCTestSetDirectoryPropertiesCommand;
  newCom5->TestHandler = this;
  cm.GetState()->AddBuiltinCommand("set_directory_properties", newCom5);

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return;
  }

  if (!mf->ReadListFile(testFilename)) {
    return;
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
}